

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_t sVar1;
  ostream *poVar2;
  long *plVar3;
  int worldSize;
  int myRank;
  MPI_Status status;
  char msg [100];
  int local_c4;
  uint local_c0;
  undefined1 local_bc [4];
  undefined1 local_b8 [8];
  int local_b0;
  int local_ac;
  int local_a8;
  char local_98 [112];
  
  MPI_Init(local_bc,local_b8);
  local_c0 = 0;
  local_c4 = 0;
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_c0);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_c4);
  sprintf(local_98,"Hi, I am CPU %d!",(ulong)local_c0);
  sVar1 = strlen(local_98);
  MPI_Send(local_98,(int)sVar1 + 1,&ompi_mpi_char,
           (long)(int)(local_c0 + 1) % (long)local_c4 & 0xffffffff,0,&ompi_mpi_comm_world);
  MPI_Recv(local_98,100,&ompi_mpi_char,0xffffffff,0xffffffff,&ompi_mpi_comm_world,&local_b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nI am CPU ",10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,". The CPU ",10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," told me: ",10);
  sVar1 = strlen(local_98);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_98,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nStatus.MPI_SOURCE = ",0x15);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nStatus.MPI_TAG = ",0x12);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_ac);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nStatus.MPI_ERROR = ",0x14);
  plVar3 = (long *)std::ostream::operator<<(poVar2,local_a8);
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    MPI_Init(&argc, &argv);

    int myRank{}, worldSize{};
    MPI_Comm_rank(MPI_COMM_WORLD, &myRank);
    MPI_Comm_size(MPI_COMM_WORLD, &worldSize);

    char msg[100];
    sprintf(msg, "Hi, I am CPU %d!", myRank);
    MPI_Send(msg, strlen(msg) + 1, MPI_CHAR, (myRank + 1) % worldSize, 0, MPI_COMM_WORLD);

    MPI_Status status;
    MPI_Recv(msg, 100, MPI_CHAR, MPI_ANY_SOURCE, MPI_ANY_TAG, MPI_COMM_WORLD, &status);

    cout << "\nI am CPU " << myRank << ". The CPU " << status.MPI_SOURCE << " told me: " << msg 
         << "\nStatus.MPI_SOURCE = " << status.MPI_SOURCE
         << "\nStatus.MPI_TAG = "<< status.MPI_TAG
         << "\nStatus.MPI_ERROR = "<< status.MPI_ERROR << endl;

    MPI_Finalize();
    return 0;
}